

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strispassword_s.c
# Opt level: O2

_Bool strispassword_s(char *dest,rsize_t dmax)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  errno_t error;
  rsize_t rVar5;
  uint uVar6;
  char *msg;
  int iVar7;
  char cVar8;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (dest == (char *)0x0) {
    msg = "strispassword_s: dest is null";
    error = 400;
  }
  else if (dmax < 6) {
    msg = "strispassword_s: dest is too short";
    error = 0x192;
  }
  else {
    if (dmax < 0x21) {
      cVar8 = *dest;
      uVar6 = 0;
      if (cVar8 != '\0') {
        rVar5 = 0;
        uVar4 = 0;
        iVar7 = 0;
        iVar3 = 0;
        while (cVar8 != '\0') {
          if (dmax == rVar5) {
            msg = "strispassword_s: dest is unterminated";
            error = 0x197;
            goto LAB_0010595f;
          }
          if ((byte)(cVar8 - 0x30U) < 10) {
            iVar7 = iVar7 + 1;
          }
          else if ((byte)(cVar8 + 0x9fU) < 0x1a) {
            uVar6 = uVar6 + 1;
          }
          else if ((byte)(cVar8 + 0xbfU) < 0x1a) {
            uVar4 = uVar4 + 1;
          }
          else {
            if ((((0xe < (byte)(cVar8 - 0x21U)) && (6 < (byte)(cVar8 - 0x3aU))) &&
                (3 < (byte)(cVar8 + 0xa5U))) &&
               ((1 < (byte)(cVar8 + 0xa1U) && ((byte)(cVar8 + 0x81U) < 0xfc)))) {
              uVar6 = 0;
              goto LAB_00105964;
            }
            iVar3 = iVar3 + 1;
          }
          lVar2 = rVar5 + 1;
          rVar5 = rVar5 + 1;
          cVar8 = dest[lVar2];
        }
        uVar6 = (uint)(iVar3 != 0 &&
                      ((1 < uVar4 && 1 < uVar6) && (iVar7 != 0 && (uint)rVar5 < 0x20)));
      }
      goto LAB_00105964;
    }
    msg = "strispassword_s: dest exceeds max";
    error = 0x193;
  }
LAB_0010595f:
  uVar6 = 0;
  invoke_safe_str_constraint_handler(msg,(void *)0x0,error);
LAB_00105964:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SUB41(uVar6,0);
  }
  __stack_chk_fail();
}

Assistant:

bool
strispassword_s (const char *dest, rsize_t dmax)
{
    uint32_t cnt_all;
    uint32_t cnt_lowercase;
    uint32_t cnt_uppercase;
    uint32_t cnt_numbers;
    uint32_t cnt_specials;

    if (!dest) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest is null",
                   NULL, ESNULLP);
        return (false);
    }

    if (dmax < SAFE_STR_PASSWORD_MIN_LENGTH) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest is too short",
                   NULL, ESLEMIN);
        return (false);
    }

    if (dmax > SAFE_STR_PASSWORD_MAX_LENGTH) {
        invoke_safe_str_constraint_handler("strispassword_s: "
                   "dest exceeds max",
                   NULL, ESLEMAX);
        return (false);
    }

    if (*dest == '\0') {
        return (false);
    }

    cnt_all = cnt_lowercase = cnt_uppercase = 0;
    cnt_numbers = cnt_specials = 0;

    while (*dest) {

        if (dmax == 0) {
            invoke_safe_str_constraint_handler(
                      "strispassword_s: dest is unterminated",
                       NULL, ESUNTERM);
            return (false);
        }
        dmax--;

        cnt_all++;

        if ((*dest >= '0') && (*dest <= '9')) {
            cnt_numbers++;

        } else if ((*dest >= 'a') && (*dest <= 'z')) {
            cnt_lowercase++;

        } else if ((*dest >= 'A') && (*dest <= 'Z')) {
            cnt_uppercase++;

        /* allow all specials */
        } else if ((*dest >= 33) && (*dest <= 47)) {
            cnt_specials++;
        } else if ((*dest >= 58) && (*dest <= 64)) {
            cnt_specials++;
        } else if ((*dest >= 91) && (*dest <= 94)) {
            cnt_specials++;
        } else if ((*dest >= 95) && (*dest <= 96)) {
            cnt_specials++;
        } else if ((*dest >= 123) && (*dest <= 126)) {
            cnt_specials++;

        } else {
            /* illegal char in password string */
            return (false);
        }
        dest++;
    }

    if (cnt_all < SAFE_STR_PASSWORD_MAX_LENGTH &&
        cnt_numbers >=  SAFE_STR_MIN_NUMBERS &&
        cnt_lowercase >= SAFE_STR_MIN_LOWERCASE &&
        cnt_uppercase >= SAFE_STR_MIN_UPPERCASE &&
        cnt_specials >= SAFE_STR_MIN_SPECIALS ) {
        return (true);
    } else {
        return (false);
    }
}